

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O0

void fs_get_serializer_metainfo_f(void *serializer,char *name,int name_length,float *value)

{
  char *pcVar1;
  MetainfoSet *this;
  ulong uVar2;
  allocator local_51;
  string local_50;
  void *local_30;
  Serializer *sp;
  float *value_local;
  char *pcStack_18;
  int name_length_local;
  char *name_local;
  void *serializer_local;
  
  local_30 = serializer;
  sp = (Serializer *)value;
  value_local._4_4_ = name_length;
  pcStack_18 = name;
  name_local = (char *)serializer;
  this = ser::Serializer::globalMetainfo((Serializer *)serializer);
  pcVar1 = pcStack_18;
  uVar2 = (ulong)value_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,pcVar1,uVar2,&local_51);
  ser::MetainfoSet::ExtractValue<float>(this,&local_50,(float *)sp);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

void fs_get_serializer_metainfo_f(void* serializer, const char* name, int name_length, float* value)
{
    Serializer& sp = *reinterpret_cast<Serializer*>(serializer);
    sp.globalMetainfo().ExtractValue(std::string(name, name_length), *value);
}